

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_amount.cpp
# Opt level: O1

Amount cfd::core::operator+(int64_t satoshi_amount,Amount *amount)

{
  long lVar1;
  Amount AVar2;
  
  lVar1 = amount->amount_;
  Amount::CheckValidAmount(0x343e78);
  Amount::CheckValidAmount(0x343e80);
  Amount::CheckValidAmount(0x343e8b);
  AVar2._8_8_ = 0;
  AVar2.amount_ = satoshi_amount + lVar1;
  return AVar2;
}

Assistant:

Amount operator+(const int64_t satoshi_amount, const Amount& amount) {
  return Amount::CreateBySatoshiAmount(amount.GetSatoshiValue()) +=
         satoshi_amount;
}